

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermIterators.cpp
# Opt level: O0

bool __thiscall Kernel::VariableIterator::hasNext(VariableIterator *this)

{
  bool bVar1;
  Term *this_00;
  long in_RDI;
  Term *trm;
  TermList *t;
  TermList *in_stack_ffffffffffffffc8;
  Stack<const_Kernel::TermList_*> *in_stack_ffffffffffffffd0;
  TermList *local_18;
  
  bVar1 = Lib::Stack<const_Kernel::TermList_*>::isEmpty
                    ((Stack<const_Kernel::TermList_*> *)(in_RDI + 0x10));
  if (!bVar1) {
    if ((*(byte *)(in_RDI + 0x30) & 1) == 0) {
      Lib::Stack<const_Kernel::TermList_*>::top((Stack<const_Kernel::TermList_*> *)(in_RDI + 0x10));
      bVar1 = TermList::isVar((TermList *)in_stack_ffffffffffffffd0);
      if (bVar1) {
        return true;
      }
    }
    while (bVar1 = Lib::Stack<const_Kernel::TermList_*>::isEmpty
                             ((Stack<const_Kernel::TermList_*> *)(in_RDI + 0x10)),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      local_18 = Lib::Stack<const_Kernel::TermList_*>::pop
                           ((Stack<const_Kernel::TermList_*> *)(in_RDI + 0x10));
      if (((*(byte *)(in_RDI + 0x30) & 1) != 0) &&
         (bVar1 = TermList::isVar((TermList *)in_stack_ffffffffffffffd0), bVar1)) {
        *(undefined1 *)(in_RDI + 0x30) = 0;
        local_18 = TermList::next(local_18);
      }
      bVar1 = TermList::isEmpty((TermList *)0x99310b);
      if (!bVar1) {
        bVar1 = TermList::isVar((TermList *)in_stack_ffffffffffffffd0);
        if (bVar1) {
          Lib::Stack<const_Kernel::TermList_*>::push
                    (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
          return true;
        }
        in_stack_ffffffffffffffd0 = (Stack<const_Kernel::TermList_*> *)(in_RDI + 0x10);
        TermList::next(local_18);
        Lib::Stack<const_Kernel::TermList_*>::push
                  (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        this_00 = TermList::term((TermList *)0x99316c);
        bVar1 = Term::shared((Term *)0x99317b);
        if ((!bVar1) || (bVar1 = Term::ground((Term *)0x99318b), !bVar1)) {
          in_stack_ffffffffffffffc8 = (TermList *)(in_RDI + 0x10);
          Term::args(this_00);
          Lib::Stack<const_Kernel::TermList_*>::push
                    (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        }
      }
    }
  }
  return false;
}

Assistant:

bool VariableIterator::hasNext()
{
  if(_stack.isEmpty()) {
    return false;
  }
  if(!_used && _stack.top()->isVar()) {
    return true;
  }
  while(!_stack.isEmpty()) {
    const TermList* t=_stack.pop();
    if(_used && t->isVar()) {
      _used=false;
      t=t->next();
    }
    if(t->isEmpty()) {
	continue;
    }
    if(t->isVar()) {
      ASS(!_used);
      _stack.push(t);
      return true;
    }
    _stack.push(t->next());
    ASS(t->isTerm());
    const Term* trm=t->term();
    if(!trm->shared() || !trm->ground()) {
      _stack.push(trm->args());
    }
  }
  return false;
}